

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
ParserProbModelXML::ParseArray(ParserProbModelXML *this,xmlNodePtr node)

{
  byte bVar1;
  size_type sVar2;
  mapped_type pvVar3;
  char *pcVar4;
  vector<double,_std::allocator<double>_> *this_00;
  mapped_type *ppvVar5;
  long in_RSI;
  ParserProbModelXML *in_RDI;
  double d;
  stringstream data;
  vector<double,_std::allocator<double>_> *p;
  key_type *in_stack_fffffffffffffe08;
  map<_xmlNode_*,_std::vector<double,_std::allocator<double>_>_*,_std::less<_xmlNode_*>,_std::allocator<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>_>
  *in_stack_fffffffffffffe10;
  xmlDocPtr in_stack_fffffffffffffe38;
  double local_1b8 [3];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  mapped_type local_18;
  long local_10;
  
  local_10 = in_RSI;
  sVar2 = std::
          map<_xmlNode_*,_std::vector<double,_std::allocator<double>_>_*,_std::less<_xmlNode_*>,_std::allocator<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>_>
          ::count(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  if (sVar2 == 0) {
    pvVar3 = (mapped_type)operator_new(0x18);
    (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0xa85576);
    local_18 = pvVar3;
    std::__cxx11::stringstream::stringstream(local_1a0);
    in_stack_fffffffffffffe38 = GetDoc(in_RDI);
    pcVar4 = (char *)xmlNodeListGetString
                               (in_stack_fffffffffffffe38,*(undefined8 *)(local_10 + 0x18),1);
    std::operator<<(local_190,pcVar4);
    while( true ) {
      bVar1 = std::ios::eof();
      pvVar3 = local_18;
      if (((bVar1 ^ 0xff) & 1) == 0) break;
      this_00 = (vector<double,_std::allocator<double>_> *)
                std::istream::operator>>(local_1a0,std::skipws);
      std::istream::operator>>(this_00,local_1b8);
      std::vector<double,_std::allocator<double>_>::push_back
                (this_00,(value_type_conflict3 *)in_stack_fffffffffffffe08);
    }
    ppvVar5 = std::
              map<_xmlNode_*,_std::vector<double,_std::allocator<double>_>_*,_std::less<_xmlNode_*>,_std::allocator<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>_>
              ::operator[]((map<_xmlNode_*,_std::vector<double,_std::allocator<double>_>_*,_std::less<_xmlNode_*>,_std::allocator<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>_>
                            *)in_RDI,(key_type *)in_stack_fffffffffffffe38);
    *ppvVar5 = pvVar3;
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  ppvVar5 = std::
            map<_xmlNode_*,_std::vector<double,_std::allocator<double>_>_*,_std::less<_xmlNode_*>,_std::allocator<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>_>
            ::operator[]((map<_xmlNode_*,_std::vector<double,_std::allocator<double>_>_*,_std::less<_xmlNode_*>,_std::allocator<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>_>
                          *)in_RDI,(key_type *)in_stack_fffffffffffffe38);
  return *ppvVar5;
}

Assistant:

const vector<double>* ParserProbModelXML::ParseArray(const xmlNodePtr node)
{
    if(_m_arrayCache.count(node) == 0)
    {
      //need to create new array
      vector<double>* p = new vector<double>();
      stringstream data;
      data << (char*) xmlNodeListGetString(GetDoc(), node->xmlChildrenNode, 1);

      double d;
      while(!data.eof())
      {
        data >> skipws >> d;
        p->push_back(d);
      }
      
      _m_arrayCache[node] = p;
    }

    return _m_arrayCache[node];
}